

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O2

void opengv::printEssentialMatrix(translation_t *position,rotation_t *rotation)

{
  size_t r;
  long lVar1;
  ostream *poVar2;
  long lVar3;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *pPVar4;
  double dVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  essential_t E;
  Matrix3d t_skew;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_c0;
  rotation_t *local_b8;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_b0 [8];
  undefined8 local_a8;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_68 [8];
  double local_60;
  ulong local_58;
  ulong uStack_50;
  double local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  pPVar4 = local_b0;
  local_a8 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (local_68,(DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       *)pPVar4);
  local_40 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0];
  auVar7._0_8_ = -local_40;
  auVar7._8_8_ = 0x8000000000000000;
  local_30 = vmovlpd_avx(auVar7);
  auVar7 = *(undefined1 (*) [16])
            ((position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array + 1);
  local_60 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  local_58 = auVar7._0_8_ ^ 0x8000000000000000;
  uStack_50 = auVar7._8_8_ ^ 0x8000000000000000;
  local_38 = vmovlpd_avx(auVar7);
  local_c0 = local_68;
  local_b8 = rotation;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            (pPVar4,(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                     *)&local_c0);
  auVar6 = ZEXT864(0) << 0x40;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
      auVar6 = ZEXT864((ulong)(auVar6._0_8_ +
                              *(double *)(pPVar4 + lVar3) * *(double *)(pPVar4 + lVar3)));
    }
    pPVar4 = pPVar4 + 8;
  }
  if (auVar6._0_8_ < 0.0) {
    dVar5 = sqrt(auVar6._0_8_);
  }
  else {
    auVar7 = vsqrtsd_avx(auVar6._0_16_,auVar6._0_16_);
    dVar5 = auVar7._0_8_;
  }
  pPVar4 = local_b0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
      *(double *)(pPVar4 + lVar3) = *(double *)(pPVar4 + lVar3) / dVar5;
    }
    pPVar4 = pPVar4 + 8;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"the random essential matrix is:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_b0);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
opengv::printEssentialMatrix(
    const translation_t & position,
    const rotation_t & rotation)
{
  //E transforms vectors from vp 2 to 1: x_1^T * E * x_2 = 0
  //and E = (t)_skew*R
  Eigen::Matrix3d t_skew = Eigen::Matrix3d::Zero();
  t_skew(0,1) = -position[2];
  t_skew(0,2) = position[1];
  t_skew(1,0) = position[2];
  t_skew(1,2) = -position[0];
  t_skew(2,0) = -position[1];
  t_skew(2,1) = position[0];

  essential_t E = t_skew * rotation;
  double matrixNorm = 0.0;
  for(size_t r = 0; r < 3; r++)
  {
    for(size_t c = 0; c < 3; c++)
      matrixNorm += pow(E(r,c),2);
  }
  matrixNorm = sqrt(matrixNorm);
  for(size_t r = 0; r < 3; r++)
  {
    for(size_t c = 0; c < 3; c++)
      E(r,c) = E(r,c) / matrixNorm;
  }

  std::cout << "the random essential matrix is:" << std::endl;
  std::cout << E << std::endl;
}